

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O0

void deserialize_duplicate_array(void)

{
  void *unaff_retaddr;
  char data [13];
  undefined3 in_stack_fffffffffffffff0;
  
  invalid_deserialize_test
            (unaff_retaddr,0x100010000,(char *)CONCAT53(0x303b,in_stack_fffffffffffffff0));
  return;
}

Assistant:

DEFINE_TEST(deserialize_duplicate_array) {
    // clang-format off
    const char data[] = {
        0x3B, 0x30, // Serial Cookie
        0, 0,       // Container count - 1
        0,          // Run Flag Bitset (no runs)
        0, 0,       // Upper 16 bits of the first container
        1, 0,       // Cardinality - 1 of the first container
        1, 0,       // first value of first container
        0, 0,       // second value of first container (LESS THAN FIRST)
    };
    // clang-format on
    invalid_deserialize_test(data, sizeof(data), "duplicate array values");
}